

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

void vstprintf_s(tchar_t *Out,size_t OutLen,tchar_t *Mask,__va_list_tag *Arg)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  undefined8 *puVar7;
  double *pdVar8;
  fourcc_t *pfVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  byte *pbVar13;
  long *plVar14;
  uint uVar15;
  int *piVar16;
  ulong *puVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  size_t sVar33;
  bool bVar34;
  bool bVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  
  if (1 < OutLen) {
    do {
      bVar19 = *Mask;
      if (bVar19 != 0x25) {
        if (bVar19 != 0) {
          Mask = (tchar_t *)((byte *)Mask + 1);
          *Out = bVar19;
LAB_001113f1:
          Out = (tchar_t *)((byte *)Out + 1);
          OutLen = OutLen - 1;
          goto LAB_00112267;
        }
        OutLen = 1;
        break;
      }
      bVar19 = ((byte *)Mask)[1];
      if (bVar19 == 0x25) {
        Mask = (tchar_t *)((byte *)Mask + 2);
        *Out = 0x25;
        goto LAB_001113f1;
      }
      pbVar5 = (byte *)Mask + 2;
      if (bVar19 != 0x2d) {
        pbVar5 = (byte *)Mask + 1;
      }
      uVar27 = (ulong)(((byte *)Mask)[2 - (ulong)(bVar19 != 0x2d)] == 0x30);
      pbVar6 = pbVar5 + uVar27;
      lVar21 = -1;
      if (0xfffffff5 < (int)(char)pbVar5[uVar27] - 0x3aU) {
        lVar21 = 0;
        bVar1 = *pbVar6;
        while (0xfffffff5 < (int)(char)bVar1 - 0x3aU) {
          lVar21 = (long)(char)bVar1 + lVar21 * 10 + -0x30;
          pbVar5 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          bVar1 = *pbVar5;
        }
      }
      if (*pbVar6 == 0x2e) {
        pbVar5 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        uVar22 = 0;
        if ((0xfffffff5 < (int)(char)*pbVar5 - 0x3aU) &&
           (uVar15 = (int)(char)*pbVar6 - 0x30, uVar15 < 10)) {
          uVar22 = 0;
          do {
            uVar22 = uVar15 + uVar22 * 10;
            pbVar5 = pbVar6 + 1;
            pbVar6 = pbVar6 + 1;
            uVar15 = (int)(char)*pbVar5 - 0x30;
          } while (uVar15 < 10);
        }
      }
      else {
        uVar22 = (uint)(*pbVar6 == 0x2e);
      }
      if (*pbVar6 == 0x2a) {
        uVar15 = Arg->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          piVar16 = (int *)((ulong)uVar15 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar15 + 8;
        }
        else {
          piVar16 = (int *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = piVar16 + 2;
        }
        pbVar6 = pbVar6 + 1;
        lVar21 = (long)*piVar16;
      }
      bVar35 = false;
      for (; *pbVar6 == 0x6c; pbVar6 = pbVar6 + 1) {
        bVar35 = true;
      }
      if ((*pbVar6 == 0x49) && (pbVar6[1] == 0x36)) {
        if (pbVar6[2] == 0x34) {
          bVar35 = true;
        }
        pbVar6 = pbVar6 + (ulong)(pbVar6[2] == 0x34) * 3;
      }
      bVar34 = *pbVar6 == 0x75;
      pbVar5 = pbVar6 + bVar34;
      bVar1 = pbVar6[bVar34];
      if (bVar1 < 0x58) {
        if (bVar1 == 0x45) goto switchD_00111555_caseD_65;
        if (bVar1 == 0x47) goto switchD_00111555_caseD_66;
        if (bVar1 != 0x53) goto switchD_00111555_caseD_68;
        uVar22 = Arg->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          puVar7 = (undefined8 *)((ulong)uVar22 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar22 + 8;
        }
        else {
          puVar7 = (undefined8 *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = puVar7 + 1;
        }
        pcVar2 = (char *)*puVar7;
        sVar12 = strlen(pcVar2);
        uVar27 = OutLen - 1;
        uVar31 = uVar27;
        if (sVar12 < uVar27) {
          uVar31 = sVar12;
        }
        uVar11 = lVar21 - uVar31;
        uVar18 = uVar11;
        if (((bVar19 != 0x2d) && (uVar18 = uVar11 - 1, 0 < (long)uVar11)) && (1 < OutLen)) {
          uVar11 = OutLen - 2;
          if (uVar18 < OutLen - 2) {
            uVar11 = uVar18;
          }
          memset(Out,0x20,uVar11 + 1);
          if (uVar27 <= sVar12) {
            sVar12 = uVar27;
          }
          Out = (tchar_t *)((byte *)Out + uVar11 + 1);
          OutLen = uVar27 - uVar11;
          uVar18 = (lVar21 - (sVar12 + uVar11)) - 2;
        }
        if ((uVar31 != 0) && (1 < OutLen)) {
          lVar21 = 0;
          do {
            bVar19 = pcVar2[lVar21];
            if (bVar19 == 0) {
              Out = (tchar_t *)((byte *)Out + lVar21);
              goto LAB_001121fc;
            }
            ((byte *)Out)[lVar21] = bVar19;
            OutLen = OutLen - 1;
            lVar10 = lVar21 + 1;
          } while ((uVar31 - 1 != lVar21) && (lVar21 = lVar10, 1 < OutLen));
          Out = (tchar_t *)((byte *)Out + lVar10);
        }
LAB_001121fc:
        if ((0 < (long)uVar18) && (1 < OutLen)) {
          uVar18 = uVar18 - 1;
          goto LAB_00112213;
        }
      }
      else {
        switch(bVar1) {
        case 99:
          pbVar6 = (byte *)Out;
          uVar27 = OutLen;
          if (bVar19 == 0x2d) {
            uVar31 = lVar21 - 1;
          }
          else {
            uVar31 = lVar21 - 2;
            if ((1 < lVar21) && (1 < OutLen)) {
              uVar27 = uVar31;
              if (OutLen - 2 < uVar31) {
                uVar27 = OutLen - 2;
              }
              memset(Out,0x20,uVar27 + 1);
              uVar31 = (lVar21 - uVar27) - 3;
              pbVar6 = (byte *)Out + uVar27 + 1;
              uVar27 = OutLen + ~uVar27;
            }
          }
          uVar22 = Arg->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            pbVar13 = (byte *)((ulong)uVar22 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar22 + 8;
          }
          else {
            pbVar13 = (byte *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = pbVar13 + 8;
          }
          *pbVar6 = *pbVar13;
          Out = (tchar_t *)(pbVar6 + 1);
          OutLen = uVar27 - 1;
          if ((0 < (long)uVar31) && (1 < OutLen)) {
            uVar18 = uVar31 - 1;
            if (uVar27 - 3 < uVar31 - 1) {
              uVar18 = uVar27 - 3;
            }
            memset(Out,0x20,uVar18 + 1);
            Out = (tchar_t *)(pbVar6 + uVar18 + 2);
            OutLen = (uVar27 - uVar18) - 2;
          }
          break;
        case 0x65:
switchD_00111555_caseD_65:
          uVar22 = Arg->fp_offset;
          if ((ulong)uVar22 < 0xa1) {
            pdVar8 = (double *)((ulong)uVar22 + (long)Arg->reg_save_area);
            Arg->fp_offset = uVar22 + 0x10;
          }
          else {
            pdVar8 = (double *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = pdVar8 + 1;
          }
          dVar36 = *pdVar8;
          if (dVar36 < 0.0) {
            *Out = 0x2d;
            Out = (tchar_t *)((byte *)Out + 1);
            OutLen = OutLen - 1;
            dVar36 = -dVar36;
          }
          if (1.0 <= dVar36) {
            iVar4 = -1;
            dVar37 = 1.0;
            if (1.0 < dVar36) {
              dVar37 = 1.0;
              do {
                dVar37 = dVar37 * 10.0;
                iVar4 = iVar4 + 1;
              } while (1.0 < dVar36 * dVar37);
            }
            dVar36 = dVar36 * 10.0;
          }
          else {
            iVar4 = 0;
            if (1.0 <= dVar36) {
              dVar37 = 1.0;
            }
            else {
              iVar4 = 0;
              dVar37 = 1.0;
              do {
                dVar37 = dVar37 * 10.0;
                iVar4 = iVar4 + -1;
              } while (dVar36 * dVar37 < 1.0);
            }
          }
          if (4 < OutLen) {
            dVar37 = dVar37 * dVar36;
            dVar38 = (dVar37 - (double)(int)dVar37) * 10.0;
            dVar36 = dVar38 + 1.0;
            if (dVar38 - (double)(int)dVar38 <= 0.5) {
              dVar36 = dVar38;
            }
            *Out = (char)(int)dVar37 + 0x30;
            ((byte *)Out)[1] = 0x2e;
            ((byte *)Out)[2] = (char)(int)dVar36 + 0x30;
            ((byte *)Out)[3] = *pbVar5;
            Out = (tchar_t *)((byte *)Out + 4);
            OutLen = OutLen - 4;
          }
          if (iVar4 < 0 && 1 < OutLen) {
            *Out = 0x2d;
            Out = (tchar_t *)((byte *)Out + 1);
            OutLen = OutLen - 1;
            iVar4 = -iVar4;
          }
          if (3 < OutLen) {
            *Out = (char)(iVar4 / 100) + 0x30;
            cVar3 = (char)((iVar4 % 100) / 10);
            ((byte *)Out)[1] = cVar3 + 0x30;
            ((byte *)Out)[2] = (char)(iVar4 % 100) + cVar3 * -10 + 0x30;
            Out = (tchar_t *)((byte *)Out + 3);
            OutLen = OutLen - 3;
          }
          break;
        case 0x66:
        case 0x67:
switchD_00111555_caseD_66:
          uVar15 = Arg->fp_offset;
          if ((ulong)uVar15 < 0xa1) {
            pdVar8 = (double *)((ulong)uVar15 + (long)Arg->reg_save_area);
            Arg->fp_offset = uVar15 + 0x10;
          }
          else {
            pdVar8 = (double *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = pdVar8 + 1;
          }
          dVar36 = *pdVar8;
          dVar37 = -dVar36;
          if (-dVar36 <= dVar36) {
            dVar37 = dVar36;
          }
          lVar10 = lVar21;
          if (-1 < lVar21) {
            lVar26 = (long)dVar37;
            uVar20 = 0;
            uVar15 = 0;
            if (0 < lVar26) {
              uVar15 = 0;
              uVar27 = 1;
              do {
                uVar15 = uVar15 + 1;
                if (0x147ae147ae147ad < uVar27) break;
                uVar27 = uVar27 * 10;
              } while ((long)uVar27 <= lVar26);
            }
            if (lVar26 < 0xccccccccccccccb) {
              uVar20 = 0;
              lVar26 = lVar26 + 1;
              do {
                uVar20 = uVar20 + 1;
                bVar35 = lVar26 < 0x147ae147ae147ae;
                lVar26 = lVar26 * 10;
              } while (bVar35);
            }
            uVar25 = ((int)lVar21 - (uint)(dVar36 < 0.0)) + ~uVar15;
            if ((int)uVar20 < (int)uVar25) {
              uVar25 = uVar20;
            }
            if ((int)uVar25 < 1) {
              uVar20 = 0;
            }
            else {
              lVar30 = (long)(int)dVar37;
              uVar20 = 0;
              lVar26 = 1;
              uVar29 = 1;
              do {
                lVar26 = lVar26 * 10;
                uVar32 = (uint)((double)lVar26 * dVar37 - (double)(lVar30 * 10));
                lVar30 = lVar30 * 10 + (ulong)uVar32;
                if (uVar32 != 0) {
                  uVar20 = uVar29;
                }
                bVar35 = uVar29 != uVar25;
                uVar29 = uVar29 + 1;
              } while (bVar35);
            }
            uVar25 = uVar20;
            if ((int)uVar20 < (int)uVar22) {
              uVar25 = uVar22;
            }
            if ((int)uVar22 < 1) {
              uVar25 = uVar20;
            }
            iVar4 = uVar15 + (dVar36 < 0.0);
            lVar26 = (long)(int)(iVar4 + (uint)(uVar25 != 0));
            if ((lVar26 <= lVar21) && (bVar19 != 0x2d)) {
              pbVar6 = (byte *)Out;
              do {
                Out = (tchar_t *)pbVar6;
                if ((lVar10 <= (int)(iVar4 + uVar25 + (uint)(uVar25 != 0))) || (OutLen < 2)) break;
                Out = (tchar_t *)(pbVar6 + 1);
                lVar10 = lVar10 + -1;
                OutLen = OutLen - 1;
                *pbVar6 = 0x20;
                pbVar6 = (byte *)Out;
              } while (bVar19 != 0x2d);
            }
            if (lVar21 < lVar26) {
              *Out = 0x65;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
              break;
            }
          }
          uVar27 = OutLen;
          if ((dVar36 < 0.0) && (1 < OutLen)) {
            *Out = 0x2d;
            Out = (tchar_t *)((byte *)Out + 1);
            uVar27 = OutLen - 1;
          }
          uVar15 = (uint)dVar37;
          uVar31 = 1000000000;
          if (uVar15 < 1000000000) {
            uVar18 = 1000000000;
            do {
              uVar31 = uVar18 / 10;
              uVar11 = uVar18 / 10;
              uVar18 = uVar31;
            } while (uVar15 + (uVar15 == 0) < (uint)uVar11);
          }
          uVar18 = uVar27;
          uVar20 = uVar15;
          if ((int)uVar31 != 0) {
            do {
              uVar11 = (ulong)uVar20;
              uVar20 = (uint)(uVar11 % uVar31);
              uVar27 = 1;
              if ((1 < uVar18) &&
                 ((lVar10 < 0 ||
                  (bVar35 = lVar10 != 0, lVar10 = lVar10 + -1, uVar27 = uVar18, bVar35)))) {
                *Out = (char)(uVar11 / uVar31) + 0x30;
                Out = (tchar_t *)((byte *)Out + 1);
                uVar27 = uVar18 - 1;
              }
              uVar25 = (uint)uVar31;
              uVar31 = uVar31 / 10;
              uVar18 = uVar27;
            } while (9 < uVar25);
          }
          lVar26 = (long)(int)uVar15;
          lVar21 = lVar26 + 1;
          uVar15 = 1;
          do {
            uVar20 = uVar15;
            bVar35 = lVar21 < 0x147ae147ae147ae;
            lVar21 = lVar21 * 10;
            uVar15 = uVar20 + 1;
          } while (bVar35);
          if (uVar22 == 0) {
            uVar22 = 0x1e;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          else {
            if ((int)uVar22 < (int)uVar20) {
              uVar20 = uVar22;
            }
            iVar4 = uVar20 + 1;
            uVar22 = 0;
            lVar21 = 1;
            uVar15 = 1;
            lVar30 = lVar26;
            do {
              lVar21 = lVar21 * 10;
              uVar20 = (uint)((double)lVar21 * dVar37 - (double)(lVar30 * 10));
              if (uVar20 != 0) {
                uVar22 = uVar15;
              }
              lVar30 = lVar30 * 10 + (ulong)uVar20;
              iVar4 = iVar4 + -1;
              uVar15 = uVar15 + 1;
            } while (1 < iVar4);
          }
          uVar15 = 6;
          if (6 < uVar22) {
            uVar15 = uVar22;
          }
          if (uVar22 == 0) {
            uVar15 = uVar22;
          }
          if (*pbVar5 != 0x66) {
            uVar15 = uVar22;
          }
          OutLen = uVar27;
          if ((uVar15 == 0) || (uVar27 < 2)) goto switchD_00111555_caseD_68;
          *Out = 0x2e;
          OutLen = uVar27 - 1;
          if (OutLen < 2) {
            Out = (tchar_t *)((byte *)Out + 1);
            lVar21 = -1;
          }
          else {
            lVar30 = 1;
            lVar24 = -2;
            lVar21 = 1;
            do {
              lVar21 = lVar21 * 10;
              uVar20 = (uint)((double)lVar21 * dVar37 - (double)(lVar26 * 10));
              uVar31 = (ulong)uVar20;
              lVar26 = lVar26 * 10 + uVar31;
              uVar22 = (uint)lVar30;
              if ((uVar15 == uVar22) && (5.0 <= (double)lVar21 * dVar37 - (double)lVar26)) {
                uVar31 = (ulong)(uVar20 + 1);
              }
              ((byte *)Out)[lVar30] = (char)uVar31 + 0x30;
              lVar30 = lVar30 + 1;
            } while ((uVar15 != uVar22) &&
                    (uVar31 = uVar27 + lVar24, lVar24 = lVar24 + -1, 1 < uVar31));
            lVar21 = -lVar30;
            OutLen = uVar27 - lVar30;
            Out = (tchar_t *)((byte *)Out + lVar30);
          }
          if ((0 < lVar10 + lVar21) && (1 < OutLen)) {
            uVar27 = (lVar10 + lVar21) - 1;
            if (OutLen - 2 < uVar27) {
              uVar27 = OutLen - 2;
            }
            memset(Out,0x20,uVar27 + 1);
            Out = (tchar_t *)((byte *)Out + uVar27 + 1);
            OutLen = OutLen + ~uVar27;
          }
          break;
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x71:
        case 0x74:
        case 0x75:
        case 0x76:
        case 0x77:
switchD_00111555_caseD_68:
          break;
        case 0x70:
          if (((8 < lVar21) && (1 < OutLen)) && (lVar10 = lVar21, bVar19 != 0x2d)) {
            do {
              lVar21 = lVar10 + -1;
              *Out = 0x20;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
              if ((bVar19 == 0x2d) || (lVar10 < 10)) break;
              lVar10 = lVar21;
            } while (1 < OutLen);
          }
          uVar22 = Arg->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            plVar14 = (long *)((ulong)uVar22 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar22 + 8;
          }
          else {
            plVar14 = (long *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = plVar14 + 1;
          }
          if (1 < OutLen) {
            lVar10 = *plVar14;
            lVar26 = 0x1c;
            do {
              uVar22 = (uint)(lVar10 >> ((byte)lVar26 & 0x3f)) & 0xf;
              cVar3 = (char)uVar22;
              bVar19 = cVar3 + 0x37;
              if (uVar22 < 10) {
                bVar19 = cVar3 + 0x30;
              }
              *Out = bVar19;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
            } while ((1 < OutLen) && (bVar35 = lVar26 != 0, lVar26 = lVar26 + -4, bVar35));
          }
          if ((8 < lVar21) && (1 < OutLen)) {
            uVar18 = lVar21 - 9;
LAB_00112213:
            if (OutLen - 2 < uVar18) {
              uVar18 = OutLen - 2;
            }
            memset(Out,0x20,uVar18 + 1);
            Out = (tchar_t *)((byte *)Out + uVar18 + 1);
            sVar33 = ~uVar18;
LAB_0011225c:
            OutLen = sVar33 + OutLen;
          }
          break;
        case 0x72:
          uVar22 = Arg->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            pfVar9 = (fourcc_t *)((ulong)uVar22 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar22 + 8;
          }
          else {
            pfVar9 = (fourcc_t *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = pfVar9 + 2;
          }
          if (4 < OutLen) {
            sVar33 = FourCCToString(Out,OutLen,*pfVar9);
            Out = (tchar_t *)((byte *)Out + sVar33);
            goto LAB_0011225c;
          }
          break;
        case 0x73:
          uVar22 = Arg->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            puVar7 = (undefined8 *)((ulong)uVar22 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar22 + 8;
          }
          else {
            puVar7 = (undefined8 *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = puVar7 + 1;
          }
          pcVar2 = (char *)*puVar7;
          if (pcVar2 != (char *)0x0) {
            sVar12 = strlen(pcVar2);
            uVar27 = OutLen - 1;
            uVar31 = uVar27;
            if (sVar12 < uVar27) {
              uVar31 = sVar12;
            }
            uVar23 = lVar21 - uVar31;
            uVar18 = uVar23;
            pbVar6 = (byte *)Out;
            uVar11 = OutLen;
            if (((bVar19 != 0x2d) && (uVar18 = uVar23 - 1, 0 < (long)uVar23)) && (1 < OutLen)) {
              uVar11 = OutLen - 2;
              if (uVar18 < OutLen - 2) {
                uVar11 = uVar18;
              }
              memset(Out,0x20,uVar11 + 1);
              if (uVar27 <= sVar12) {
                sVar12 = uVar27;
              }
              uVar18 = (lVar21 - (sVar12 + uVar11)) - 2;
              pbVar6 = (byte *)Out + uVar11 + 1;
              uVar11 = uVar27 - uVar11;
            }
            memcpy(pbVar6,pcVar2,uVar31);
            Out = (tchar_t *)(pbVar6 + uVar31);
            OutLen = uVar11 - uVar31;
            if ((0 < (long)uVar18) && (1 < OutLen)) {
              uVar23 = (uVar11 - uVar31) - 2;
              uVar27 = uVar18 - 1;
              if (uVar23 < uVar18 - 1) {
                uVar27 = uVar23;
              }
              memset(Out,0x20,uVar27 + 1);
              Out = (tchar_t *)(pbVar6 + uVar31 + uVar27 + 1);
              OutLen = (~uVar27 + uVar11) - uVar31;
            }
          }
          break;
        default:
          if (bVar1 != 0x58) goto switchD_00111555_caseD_68;
        case 100:
        case 0x69:
        case 0x78:
          uVar22 = Arg->gp_offset;
          if (bVar35) {
            if (uVar22 < 0x29) {
              puVar17 = (ulong *)((long)Arg->reg_save_area + (ulong)uVar22);
              Arg->gp_offset = uVar22 + 8;
            }
            else {
              puVar17 = (ulong *)Arg->overflow_arg_area;
              Arg->overflow_arg_area = puVar17 + 1;
            }
            uVar31 = *puVar17;
          }
          else {
            if (uVar22 < 0x29) {
              piVar16 = (int *)((ulong)uVar22 + (long)Arg->reg_save_area);
              Arg->gp_offset = uVar22 + 8;
            }
            else {
              piVar16 = (int *)Arg->overflow_arg_area;
              Arg->overflow_arg_area = piVar16 + 2;
            }
            uVar31 = (ulong)*piVar16;
          }
          bVar35 = (*pbVar5 | 0x20) != 0x78;
          if (bVar35) {
            uVar11 = 10;
            uVar18 = 100000000000;
          }
          else {
            uVar18 = 0x10000000;
            uVar11 = 0x10;
          }
          uVar28 = (ulong)((long)uVar31 < 0 && (bVar35 && !bVar34));
          uVar23 = -uVar31;
          if ((long)uVar31 >= 0 || (!bVar35 || bVar34)) {
            uVar23 = uVar31;
          }
          uVar31 = 1;
          if (1 < (long)(lVar21 - uVar28)) {
            lVar21 = (lVar21 - uVar28) + 1;
            uVar22 = 1;
            do {
              uVar22 = uVar22 * (int)uVar11;
              lVar21 = lVar21 + -1;
            } while (2 < lVar21);
            uVar31 = (ulong)uVar22;
          }
          if ((long)uVar31 < (long)uVar23) {
            uVar31 = uVar23;
          }
          if (uVar31 < uVar18) {
            do {
              uVar18 = uVar18 / uVar11;
            } while ((long)uVar31 < (long)uVar18);
          }
          for (; uVar18 != 0; uVar18 = uVar18 / uVar11) {
            uVar31 = (long)uVar23 / (long)uVar18;
            uVar22 = (uint)uVar31;
            if (((1 < OutLen) && (uVar28 != 0)) &&
               ((uVar18 == 1 || ((uVar27 != 0 || (uVar22 != 0)))))) {
              *Out = 0x2d;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
              uVar28 = 0;
            }
            if (OutLen < 2) {
              OutLen = 1;
            }
            else {
              if (((uVar18 == 1) || (uVar22 != 0)) || (bVar19 = 0x20, uVar27 != 0)) {
                bVar19 = (byte)uVar31;
                if (uVar22 < 10) {
                  bVar19 = bVar19 | 0x30;
                }
                else if (*pbVar5 == 0x58) {
                  bVar19 = bVar19 + 0x37;
                }
                else {
                  bVar19 = bVar19 + 0x57;
                }
                uVar27 = 1;
              }
              *Out = bVar19;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
            }
            uVar23 = uVar23 - (uVar31 & 0xffffffff) * uVar18;
          }
        }
      }
      Mask = (tchar_t *)(pbVar5 + 1);
LAB_00112267:
    } while (1 < OutLen);
  }
  if (OutLen != 0) {
    *Out = 0;
    return;
  }
  __assert_fail("OutLen>0",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                ,0x285,
                "void vstprintf_s(tchar_t *, size_t, const tchar_t *, struct __va_list_tag *)");
}

Assistant:

void vstprintf_s(tchar_t* Out,size_t OutLen,const tchar_t* Mask,va_list Arg)
{
    int64_t vl;
	int vs;
    double dvs, _dvs;
	intptr_t Width,ptr;
	unsigned int v,w,q,w0;
	bool_t ZeroFill;
	bool_t Unsigned;
	bool_t Sign;
	bool_t AlignLeft;
    bool_t Long;
    int Decimals;
	const tchar_t *In;
	const char *InA;
	size_t n;
    int64_t lvs,_lvs,ww;

	while (OutLen>1 && *Mask)
	{
		switch (*Mask)
		{
		case '%':
			++Mask;

			if (*Mask == '%')
			{
				*(Out++) = *(Mask++);
				--OutLen;
				break;
			}

			AlignLeft = *Mask=='-';
			if (AlignLeft)
				++Mask;

			ZeroFill = *Mask=='0';
			if (ZeroFill)
				++Mask;

			Width = -1;
			if (IsDigit(*Mask))
			{
				Width = 0;
				for (;IsDigit(*Mask);++Mask)
					Width = Width*10 + (*Mask-'0');
			}

            Decimals = *Mask=='.';
			if (Decimals)
            {
				++Mask;
                Decimals = 0;
			    if (IsDigit(*Mask))
			    {
				    for (;IsDigit(*Mask);++Mask)
					    Decimals = Decimals*10 + (*Mask-'0');
			    }
            }

            Long = 0;
            if (*Mask == '*')
			{
				++Mask;
				Width = va_arg(Arg,int);
			}

            while (*Mask == 'l')
            {
                Long=1;
				++Mask; // long
            }

            if (*Mask=='I' && *(Mask+1)=='6' && *(Mask+2)=='4')
            {
                Long=1;
				Mask += 3;
            }

			Unsigned = *Mask=='u';
			if (Unsigned)
				++Mask;

			switch (*Mask)
			{
			case 'd':
			case 'i':
			case 'X':
			case 'x':
                if (Long)
				    vl = va_arg(Arg,int64_t);
                else
				    vl = va_arg(Arg,int);

				if (*Mask=='x' || *Mask=='X')
				{
					Unsigned = 1;
					q = 16;
					ww = 0x10000000;
				}
				else
				{
					q = 10;
					ww = 100000000000;
				}

				Sign = vl<0 && !Unsigned;
				if (Sign)
				{
					vl=-vl;
					--Width;
				}

				w0 = 1;
				for (;Width>1;--Width)
					w0 *= q;

				v = vl;
				while (vl<ww && ww>w0)
					ww/=q;

				while (ww>0)
				{
					unsigned int i = (unsigned int)(vl/ww); // between 0 and q-1
					vl-=i*ww;
					if (OutLen>1 && Sign && (ww==1 || ZeroFill || i>0))
					{
						*(Out++) = '-';
						--OutLen;
						Sign = 0;
					}
					if (OutLen>1)
					{
						if (i==0 && !ZeroFill && ww!=1)
							i = ' ';
						else
						{
							ZeroFill = 1;
							if (i>=10)
							{
								if (*Mask == 'X')
									i += 'A'-10;
								else
									i += 'a'-10;
							}
							else
								i+='0';
						}
						*(Out++) = (tchar_t)i;
						--OutLen;
					}
					ww/=q;
				}

				break;

			case 'c':
				Width -= 1;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
				*(Out++) = (tchar_t)va_arg(Arg,int);
				--OutLen;
				while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;

			case 's':
				In = va_arg(Arg,const tchar_t*);
                if (In)
                {
				    n = MIN(tcslen(In),OutLen-1);
				    Width -= n;
				    if (!AlignLeft)
					    while (--Width>=0 && OutLen>1)
					    {
						    *Out++ = ' ';
						    --OutLen;
					    }
				    memcpy(Out,In,n*sizeof(tchar_t));
				    Out += n;
				    OutLen -= n;
				    while (--Width>=0 && OutLen>1)
				    {
					    *Out++ = ' ';
					    --OutLen;
				    }
                }
				break;
			case 'S':
				InA = va_arg(Arg,const char*);
				n = MIN(strlen(InA),OutLen-1);
				Width -= n;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
                for (;n>0 && OutLen>1 && *InA;++InA,++Out,--OutLen,--n)
                    *Out = *InA;
    			while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;
            case 'g':
            case 'G':
            case 'f':
                dvs = va_arg(Arg,double);
                if (OutLen)
                {
			        Sign = dvs<0;
                    if (Sign && OutLen>1)
                        dvs = -dvs;

                    if (Width >= 0)
                    {
                        // count integer digits and decimal digits to adjust the alignment
                        int max_integer_digits = get_integers((int64_t)dvs);
                        int max_decimal_digits = get_decimals(Width - max_integer_digits - 1 - (Sign?1:0),(int64_t)dvs);
                        int max_total_chars;

                        vs = (int)dvs;
                        lvs = 1;
                        _lvs = vs;
                        w = w0 = 0; // decimals in use
                        while (max_decimal_digits-->0)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            w0++;
                            if (q)
                                w = w0;
                        }

                        if (Decimals>0)
                            max_decimal_digits = MAX(Decimals,(int)w);
                        else
                            max_decimal_digits = w;

                        max_total_chars = max_integer_digits + max_decimal_digits + (Sign?1:0) + (max_decimal_digits?1:0);

                        if (max_integer_digits + (Sign?1:0) + (max_decimal_digits?1:0) > Width)
                            goto do_exponent;

                        while (!AlignLeft && Width > max_total_chars && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --Width;
                            --OutLen;
                        }
                    }

                    // integer part
                    vs = (int)dvs;
			        v = vs;

                    if (Sign && dvs!=0.0 && OutLen > 1)
                    {
                        *Out++ = '-';
                        --OutLen;
                    }

				    w = 1000000000;
			        while (w>v && w>1)
				        w/=10;

                    // integer filling
                    while (w>0)
			        {
				        unsigned int i = v/w;
				        v-=i*w;
				        if (OutLen>1 && (Width<0 || Width-->0))
				        {
					        i+='0';
					        *(Out++) = (tchar_t)i;
					        --OutLen;
                        }
				        w/=10;
                    }

                    // decimal part
                    // dry run to count the number of necessary decimals
                    v = Decimals;
                    if (!Decimals)
                        Decimals=30;
                    Decimals = get_decimals(Decimals,vs);
                    lvs = 1;
                    _lvs = vs;
                    w = w0 = 0; // decimals in use
                    while (Decimals-->0)
                    {
                        lvs *= 10;
                        _lvs *= 10;
                        q = (int)(dvs * lvs - (double)_lvs);
                        _lvs += q;
                        w0++;
                        if (q)
                            w = w0;
                    }

                    if (*Mask==T('f') && w)
                        w = MAX(w,6);
                    if (w && OutLen>1)
                    {
                        *Out++ = T('.');
                        --OutLen;
                        --Width;

                        v -= w;

                        lvs = 1;
                        _lvs = vs;
                        while (w-->0 && OutLen>1)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            if (w==0) // last one, do some rounding
                            {
                                if ((dvs * lvs - (double)_lvs) >= 5)
                                    q++;
                            }
                            *Out++ = (tchar_t)(q + '0');
                            --OutLen;
                            --Width;
                        }
                        while (Width-- > 0 && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --OutLen;
                        }
                    }
                    break;
do_exponent:
                    // TODO
                    *Out++ = T('e');
                    OutLen--;
                }
                break;
            case 'e':
            case 'E':
                dvs = va_arg(Arg,double);
				Sign = dvs<0;
                if (Sign && OutLen>1)
                {
                    *Out++ = '-';
                    OutLen--;
                    dvs = -dvs;
                }
                vs = 0; // exponent
                _dvs = 1.0; // factor
                if (dvs >= 1.0)
                {
                    while (dvs*_dvs > 1.0)
                    {
                        _dvs *= 10.0;
                        vs++;
                    }
                    dvs *= 10.0;
                    vs--;
                }
                else
                {
                    while (dvs*_dvs < 1.0)
                    {
                        _dvs *= 10.0;
                        vs--;
                    }
                }

                dvs *= _dvs;
                if (OutLen > 4)
                {
                    *Out++ = (tchar_t)((int)dvs + T('0'));
                    *Out++ = T('.');
                    dvs -= (int)dvs;
                    dvs *= 10.0;
                    if (dvs - (int)dvs > 0.5)
                        *Out++ = (tchar_t)((int)(dvs+1) + T('0'));
                    else
                        *Out++ = (tchar_t)((int)(dvs) + T('0'));
                    *Out++ = *Mask;
                    OutLen -= 4;
                }
                if (OutLen > 1 && vs < 0)
                {
                    *Out++ = T('-');
                    OutLen--;
                    vs = -vs;
                }
                if (OutLen > 3)
                {
                    *Out++ = (tchar_t)((vs / 100) + T('0'));
                    vs %= 100;
                    *Out++ = (tchar_t)((vs / 10) + T('0'));
                    vs %= 10;
                    *Out++ = (tchar_t)(vs + T('0'));
                    OutLen -= 3;
                }
                break;
            case 'p':
                while (Width > 8 && !AlignLeft && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                ptr = va_arg(Arg,intptr_t);
                for (vs=28;OutLen>1 && vs>=0;vs-=4)
                {
                    q = (ptr>>vs) & 0x0F;
                    if (q<10)
                        *Out++ = (tchar_t)(q+T('0'));
                    else
                        *Out++ = (tchar_t)(q+T('A')-10);
                    OutLen--;
                }
                while (Width > 8 && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                break;
            case 'r':
                {
                    fourcc_t FourCC = va_arg(Arg,fourcc_t);
                    if (OutLen > 4)
                    {
                        size_t Written = FourCCToString(Out,OutLen,FourCC);
                        Out+=Written;
                        OutLen+=Written;
                    }
                }
                break;
			}

			++Mask;
			break;

		default:
			*(Out++) = *(Mask++);
			--OutLen;
			break;
		}
	}

	assert(OutLen>0);
    if (OutLen>0)
        *Out=0;
}